

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

Vector3f pbrt::SampleHenyeyGreenstein(Vector3f wo,Float g,Point2f u,Float *pdf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar7 [64];
  undefined8 in_XMM3_Qb;
  undefined1 auVar8 [16];
  Vector3f v;
  Tuple3<pbrt::Vector3,_float> TVar9;
  Frame wFrame;
  Frame local_34;
  
  auVar7._4_60_ = in_register_00001284;
  auVar7._0_4_ = g;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar6 = auVar7._0_16_;
  auVar4 = vandps_avx512vl(auVar6,auVar4);
  if (0.001 <= auVar4._0_4_) {
    auVar1 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
    auVar4 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar6,auVar6);
    auVar3._8_8_ = in_XMM3_Qb;
    auVar3._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
    auVar6 = vfnmadd231ss_fma(ZEXT416((uint)(g + 1.0)),ZEXT416((uint)(g + g)),auVar3);
    auVar8._0_4_ = auVar1._0_4_ / auVar6._0_4_;
    auVar8._4_12_ = auVar1._4_12_;
    auVar4 = vfnmadd231ss_fma(auVar4,auVar8,auVar8);
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar4 = vxorps_avx512vl(auVar4,auVar6);
    FVar5 = auVar4._0_4_ / (g + g);
  }
  else {
    auVar1._8_8_ = in_XMM3_Qb;
    auVar1._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar1,ZEXT416(0x3f800000));
    FVar5 = auVar4._0_4_;
  }
  auVar4 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)FVar5),ZEXT416((uint)FVar5)
                           );
  auVar4 = vmaxss_avx(auVar4,ZEXT816(0));
  auVar6 = vsqrtss_avx(auVar4,auVar4);
  auVar2._8_8_ = in_XMM3_Qb;
  auVar2._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  auVar4 = vmovshdup_avx(auVar2);
  Frame::FromZ(&local_34,wo);
  v = SphericalDirection(auVar6._0_4_,FVar5,auVar4._0_4_ * 6.2831855);
  TVar9 = (Tuple3<pbrt::Vector3,_float>)Frame::FromLocal(&local_34,v);
  if (pdf != (Float *)0x0) {
    FVar5 = HenyeyGreenstein(FVar5,g);
    *pdf = FVar5;
  }
  return (Vector3f)TVar9;
}

Assistant:

Vector3f SampleHenyeyGreenstein(Vector3f wo, Float g, Point2f u, Float *pdf) {
    // Compute $\cos \theta$ for Henyey--Greenstein sample
    Float cosTheta;
    if (std::abs(g) < 1e-3)
        cosTheta = 1 - 2 * u[0];
    else {
        Float sqrTerm = (1 - g * g) / (1 + g - 2 * g * u[0]);
        cosTheta = -(1 + g * g - sqrTerm * sqrTerm) / (2 * g);
    }

    // Compute direction _wi_ for Henyey--Greenstein sample
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Float phi = 2 * Pi * u[1];
    Frame wFrame = Frame::FromZ(wo);
    Vector3f wi = wFrame.FromLocal(SphericalDirection(sinTheta, cosTheta, phi));

    if (pdf)
        *pdf = HenyeyGreenstein(cosTheta, g);
    return wi;
}